

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void ConvertPopulationCountTableToBitEstimates
               (int num_symbols,uint32_t *population_counts,double *output)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  uVar2 = 0;
  uVar4 = 0;
  if (0 < num_symbols) {
    uVar4 = (ulong)(uint)num_symbols;
  }
  uVar3 = 0;
  uVar1 = 0;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = uVar1 + population_counts[uVar2];
    uVar3 = (uVar3 + 1) - (uint)(population_counts[uVar2] == 0);
  }
  if (uVar3 < 2) {
    memset(output,0,(long)num_symbols << 3);
    return;
  }
  if (uVar1 < 0x100) {
    fVar5 = kLog2Table[uVar1];
  }
  else {
    fVar5 = (*VP8LFastLog2Slow)(uVar1);
  }
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = population_counts[uVar2];
    if ((ulong)uVar1 < 0x100) {
      fVar6 = kLog2Table[uVar1];
    }
    else {
      fVar6 = (*VP8LFastLog2Slow)(uVar1);
    }
    output[uVar2] = (double)fVar5 - (double)fVar6;
  }
  return;
}

Assistant:

static void ConvertPopulationCountTableToBitEstimates(
    int num_symbols, const uint32_t population_counts[], double output[]) {
  uint32_t sum = 0;
  int nonzeros = 0;
  int i;
  for (i = 0; i < num_symbols; ++i) {
    sum += population_counts[i];
    if (population_counts[i] > 0) {
      ++nonzeros;
    }
  }
  if (nonzeros <= 1) {
    memset(output, 0, num_symbols * sizeof(*output));
  } else {
    const double logsum = VP8LFastLog2(sum);
    for (i = 0; i < num_symbols; ++i) {
      output[i] = logsum - VP8LFastLog2(population_counts[i]);
    }
  }
}